

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void flatbuffers::GenField<unsigned_char>
               (FieldDef *fd,Table *table,bool fixed,int indent_step,int indent,string *_text)

{
  uint uVar1;
  Table val;
  ushort uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  
  uVar1 = (fd->value).offset;
  uVar3 = (ulong)uVar1;
  if ((int)CONCAT71(in_register_00000011,fixed) == 0) {
    uVar2 = (ushort)uVar1;
    if ((*(ushort *)(table + -(long)*(int *)table) <= uVar2) ||
       (uVar3 = (ulong)*(ushort *)(table + ((ulong)uVar2 - (long)*(int *)table)), uVar3 == 0)) {
      val = (Table)0x0;
      goto LAB_0011b5e5;
    }
  }
  val = table[uVar3];
LAB_0011b5e5:
  Print<unsigned_char>((uchar)val,(fd->value).type,indent,indent_step,(StructDef *)0x0,_text);
  return;
}

Assistant:

static void GenField(const FieldDef &fd,
                                          const Table *table, bool fixed,
                                          int indent_step, int indent,
                                          std::string *_text) {
  Print(fixed ?
    reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset) :
    table->GetField<T>(fd.value.offset, 0), fd.value.type, indent, indent_step,
                       nullptr, _text);
}